

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfutil.cpp
# Opt level: O1

uint32_t bswap32(uint32_t data)

{
  return data >> 0x18 | (data & 0xff0000) >> 8 | (data & 0xff00) << 8 | data << 0x18;
}

Assistant:

uint32_t bswap32(uint32_t data){
    if(!(PARFLOWIO_LITTLE_ENDIAN)) return data;

    static_assert(CHAR_BIT == 8, "Byte conversion requires that char be 8 bits.");
    const unsigned char* alias = reinterpret_cast<unsigned char*>(&data);
    return 
        (static_cast<uint32_t>( alias[0] ) << 24) | 
        (static_cast<uint32_t>( alias[1] ) << 16) | 
        (static_cast<uint32_t>( alias[2] ) <<  8) | 
        (static_cast<uint32_t>( alias[3] ) <<  0);
}